

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.c
# Opt level: O2

int compare_x_pos(void *p,void *q)

{
  int iVar1;
  
  if (*(byte *)((long)p + 1) < *(byte *)((long)q + 1)) {
    iVar1 = -1;
  }
  else {
    if (*(byte *)((long)p + 1) <= *q) {
      return -(uint)(*(ushort *)((long)p + 4) < *(ushort *)((long)q + 4)) | 1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int compare_x_pos(const void* p, const void* q) {

    Sprite_Attribute a = *(const Sprite_Attribute*) p;
    Sprite_Attribute b = *(const Sprite_Attribute*) q;
    
    if(a.x_pos < b.x_pos) {
        return -1;
    } else if (a.x_pos > b.y_pos) {
        return 1;
    }

    if(a.oam_address < b.oam_address) {
        return -1;
    } 
    
    return 1;
}